

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_PrintfError_Test::TestBody(PrintfTest_PrintfError_Test *this)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  pointer message;
  file read_end;
  file write_end;
  int result;
  AssertionResult gtest_ar;
  file local_298;
  file local_294;
  buffered_file local_290;
  AssertHelper local_288 [2];
  int local_274;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_270;
  basic_buffer<char> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [15];
  
  local_298.fd_ = -1;
  local_294.fd_ = -1;
  fmt::v5::file::pipe(&local_298,&local_294.fd_);
  fmt::v5::file::fdopen((file *)&local_290,(int)&local_298,"r");
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_288;
  local_288[0].data_._0_4_ = 0;
  local_238.size_ = 0;
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_0023bf40;
  local_238.capacity_ = 500;
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = "test";
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = 4;
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = &local_238;
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
       ::TYPES;
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_238.ptr_ = (char *)local_218;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_270);
  sVar1 = local_238.size_;
  sVar3 = fwrite(local_238.ptr_,1,local_238.size_,(FILE *)local_290.file_);
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_0023bf40;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238.ptr_ !=
      local_218) {
    operator_delete(local_238.ptr_);
  }
  iVar4 = -1;
  if (sVar1 <= sVar3) {
    iVar4 = (int)sVar1;
  }
  fmt::v5::buffered_file::~buffered_file(&local_290);
  local_270.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ =
       (char *)((ulong)local_270.
                       super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                       .parse_context_.format_str_.data_ & 0xffffffff00000000);
  local_274 = iVar4;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)&local_238,"result","0",&local_274,(int *)&local_270);
  if ((char)local_238._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)&local_270);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)local_238.ptr_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ef,message);
    testing::internal::AssertHelper::operator=(local_288,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    if ((long *)local_270.
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                .parse_context_.format_str_.data_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_270.
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                  .parse_context_.format_str_.data_ != (long *)0x0)) {
        (**(code **)(*(long *)local_270.
                              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                              .parse_context_.format_str_.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_238.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fmt::v5::file::~file(&local_294);
  fmt::v5::file::~file(&local_298);
  return;
}

Assistant:

TEST(PrintfTest, PrintfError) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  int result = fmt::fprintf(read_end.fdopen("r").get(), "test");
  EXPECT_LT(result, 0);
}